

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

int ParseSighashString(UniValue *sighash)

{
  long lVar1;
  bool bVar2;
  undefined8 uVar3;
  T *pTVar4;
  Result<int> *in_RDI;
  long in_FS_OFFSET;
  Result<int> result;
  UniValue *in_stack_ffffffffffffff28;
  UniValue *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int iVar5;
  int in_stack_ffffffffffffff7c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = UniValue::isNull(in_stack_ffffffffffffff28);
  if (bVar2) {
    iVar5 = 0;
  }
  else {
    UniValue::get_str_abi_cxx11_(in_stack_ffffffffffffff30);
    SighashFromStr((string *)sighash);
    bVar2 = util::Result::operator_cast_to_bool((Result<int> *)in_stack_ffffffffffffff28);
    if (!bVar2) {
      uVar3 = __cxa_allocate_exception(0x58);
      util::ErrorString<int>(in_RDI);
      JSONRPCError(in_stack_ffffffffffffff7c,
                   (string *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_006c4adf;
    }
    pTVar4 = util::Result<int>::value
                       ((Result<int> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                       );
    iVar5 = *pTVar4;
    util::Result<int>::~Result((Result<int> *)in_stack_ffffffffffffff28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar5;
  }
LAB_006c4adf:
  __stack_chk_fail();
}

Assistant:

int ParseSighashString(const UniValue& sighash)
{
    if (sighash.isNull()) {
        return SIGHASH_DEFAULT;
    }
    const auto result{SighashFromStr(sighash.get_str())};
    if (!result) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, util::ErrorString(result).original);
    }
    return result.value();
}